

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testopal.cpp
# Opt level: O2

void change_setting_proc(Am_Object *self)

{
  bool bVar1;
  undefined1 uVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Am_Value *pAVar9;
  Am_Wrapper *pAVar10;
  Am_Object *pAVar11;
  undefined1 *puVar12;
  ostream *poVar13;
  char *pcVar14;
  Am_Style *pAVar15;
  byte bVar16;
  ulong uStack_120;
  Am_Input_Char c;
  Am_Object in_obj;
  Am_Object inter;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Input_Char local_94;
  Am_Input_Char local_90;
  Am_Input_Char local_8c;
  Am_Input_Char local_88;
  Am_Input_Char local_84;
  Am_Input_Char local_80;
  Am_Input_Char local_7c;
  Am_Input_Char local_78;
  Am_Input_Char local_74;
  Am_Input_Char local_70;
  Am_Input_Char local_6c;
  Am_Input_Char local_68;
  Am_Input_Char local_64;
  Am_Input_Char local_60;
  Am_Input_Char local_5c;
  Am_Input_Char local_58;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Char local_20;
  Am_Input_Char local_1c;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)self);
  pAVar9 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&c,pAVar9);
  Am_Input_Char::Am_Input_Char(&local_1c,"q",true);
  bVar1 = Am_Input_Char::operator==(&c,local_1c);
  if (bVar1) {
    pAVar10 = Am_Object::operator_cast_to_Am_Wrapper_(&screen2);
    if (pAVar10 != (Am_Wrapper *)0x0) {
      Am_Object::Destroy();
    }
    Am_Exit_Main_Event_Loop();
    goto LAB_0010437e;
  }
  Am_Input_Char::Am_Input_Char(&local_20,"?",true);
  bVar1 = Am_Input_Char::operator==(&c,local_20);
  if (bVar1) {
LAB_00103ea5:
    print_help();
    goto LAB_0010437e;
  }
  Am_Input_Char::Am_Input_Char(&local_24,"0",true);
  bVar1 = Am_Input_Char::operator==(&c,local_24);
  if (bVar1) {
    if (change_setting_proc(Am_Object)::mode0 == '\x01') {
      change_setting_proc(Am_Object)::mode0 = '\0';
      uVar4 = Am_Object::Set(0xa338,100,0x5a);
      Am_Object::Set(uVar4,0x65,0x5a);
      Am_Object::Am_Object(&local_a0,&g1);
      Am_Object::Add_Part((Am_Object)0x10a2e8,SUB81(&local_a0,0),1);
      Am_Object::~Am_Object(&local_a0);
      uVar4 = Am_Object::Set(0xa338,100,0x8c);
      uStack_120 = 0x96;
    }
    else {
      change_setting_proc(Am_Object)::mode0 = '\x01';
      uVar4 = Am_Object::Set(0xa338,100,100);
      Am_Object::Set(uVar4,0x65,100);
      Am_Object::Remove_From_Owner();
      uStack_120 = 0x5a;
      uVar4 = Am_Object::Set(0xa338,100,0x5a);
    }
    goto LAB_0010400a;
  }
  Am_Input_Char::Am_Input_Char(&local_28,"1",true);
  bVar1 = Am_Input_Char::operator==(&c,local_28);
  if (bVar1) {
    change_setting_proc(Am_Object)::mode1 = change_setting_proc(Am_Object)::mode1 != '\x01';
    if ((bool)change_setting_proc(Am_Object)::mode1) {
      pcVar14 = "Hello World!";
    }
    else {
      pcVar14 = "Test Opal";
    }
    uVar4 = 0x6c;
LAB_00104131:
    Am_Object::Set(0xa2e8,(char *)(ulong)uVar4,(ulong)pcVar14);
    goto LAB_0010437e;
  }
  Am_Input_Char::Am_Input_Char(&local_2c,"2",true);
  bVar1 = Am_Input_Char::operator==(&c,local_2c);
  if (bVar1) {
    if (change_setting_proc(Am_Object)::mode2 != '\x01') {
      change_setting_proc(Am_Object)::mode2 = '\x01';
      goto LAB_001041c4;
    }
    change_setting_proc(Am_Object)::mode2 = '\0';
    Am_Object::Create((char *)&in_obj);
    pAVar10 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    uVar4 = Am_Object::Set((ushort)&in_obj,(Am_Wrapper *)0x6a,(ulong)pAVar10);
    uVar4 = Am_Object::Set(uVar4,100,5);
    uVar4 = Am_Object::Set(uVar4,0x65,5);
    uVar4 = Am_Object::Set(uVar4,0x66,0x32);
    pAVar11 = (Am_Object *)Am_Object::Set(uVar4,0x67,0x1e);
    pAVar11 = (Am_Object *)Am_Object::operator=(&eek,pAVar11);
    Am_Object::Am_Object(&local_a8,pAVar11);
    Am_Object::Add_Part((Am_Object)0x10a338,SUB81(&local_a8,0),1);
    pAVar11 = &local_a8;
LAB_00104110:
    Am_Object::~Am_Object(pAVar11);
LAB_00104115:
    pAVar11 = &in_obj;
LAB_0010423e:
    Am_Object::~Am_Object(pAVar11);
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_30,"3",true);
    bVar1 = Am_Input_Char::operator==(&c,local_30);
    if (bVar1) {
      if (change_setting_proc(Am_Object)::mode3 != '\x01') {
        change_setting_proc(Am_Object)::mode3 = '\x01';
        uVar5 = 0xa328;
        uVar4 = Am_Object::Set(0xa328,100,100);
        bVar16 = 0;
        Am_Object::Set(uVar4,0x65,100);
        uVar2 = 0x69;
LAB_0010427c:
        Am_Object::Set(uVar5,(bool)uVar2,(ulong)bVar16);
        goto LAB_0010437e;
      }
      change_setting_proc(Am_Object)::mode3 = '\0';
      Am_Object::Set(0xa328,true,1);
      uStack_120 = 0x14;
      uVar4 = Am_Object::Set(0xa328,100,0x14);
LAB_0010400a:
      uVar5 = 0x65;
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_34,"4",true);
      bVar1 = Am_Input_Char::operator==(&c,local_34);
      if (bVar1) {
        if (change_setting_proc(Am_Object)::mode4 != '\x01') {
          puVar12 = &change_setting_proc(Am_Object)::mode4;
LAB_0010430f:
          *puVar12 = 1;
          Am_Object::Remove_From_Owner();
          goto LAB_0010437e;
        }
        change_setting_proc(Am_Object)::mode4 = '\0';
        Am_Object::Am_Object(&local_b0,&g1);
        Am_Object::Add_Part((Am_Object)0x10a2e8,SUB81(&local_b0,0),1);
        pAVar11 = &local_b0;
        goto LAB_0010423e;
      }
      Am_Input_Char::Am_Input_Char(&local_38,"5",true);
      bVar1 = Am_Input_Char::operator==(&c,local_38);
      if (bVar1) {
        cVar3 = Am_Object::Valid();
        if (cVar3 == '\0') {
          std::operator<<((ostream *)&std::cout,
                          "** Can\'t do test 5 now because rectangle is gone; Use 2 to bring it back\n"
                         );
          std::ostream::flush();
          goto LAB_0010437e;
        }
        if (change_setting_proc(Am_Object)::mode5 == '\x01') {
          change_setting_proc(Am_Object)::mode5 = '\0';
          uStack_120 = 5;
          uVar4 = Am_Object::Set(0xa340,100,5);
        }
        else {
          change_setting_proc(Am_Object)::mode5 = '\x01';
          uStack_120 = 10;
          uVar4 = Am_Object::Set(0xa340,100,10);
        }
        goto LAB_0010400a;
      }
      Am_Input_Char::Am_Input_Char(&local_3c,"6",true);
      bVar1 = Am_Input_Char::operator==(&c,local_3c);
      if (bVar1) {
        change_setting_proc(Am_Object)::mode6 = change_setting_proc(Am_Object)::mode6 != '\x01';
        if ((bool)change_setting_proc(Am_Object)::mode6) {
          uStack_120 = 0x82;
        }
        else {
          uStack_120 = 0x96;
        }
        uVar5 = 0x65;
LAB_00104419:
        uVar4 = 0xa308;
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_40,"7",true);
        bVar1 = Am_Input_Char::operator==(&c,local_40);
        if (bVar1) {
          if (change_setting_proc(Am_Object)::mode7 == '\x01') {
            change_setting_proc(Am_Object)::mode7 = '\0';
            bVar16 = 1;
            uVar2 = 0x69;
            uVar5 = 0xa308;
          }
          else {
            change_setting_proc(Am_Object)::mode7 = '\x01';
            uVar2 = 0x69;
            uVar5 = 0xa308;
            bVar16 = 0;
          }
          goto LAB_0010427c;
        }
        Am_Input_Char::Am_Input_Char(&local_44,"8",true);
        bVar1 = Am_Input_Char::operator==(&c,local_44);
        if (bVar1) {
          change_setting_proc(Am_Object)::mode8 = change_setting_proc(Am_Object)::mode8 != '\x01';
          if ((bool)change_setting_proc(Am_Object)::mode8) {
            uStack_120 = 100;
          }
          else {
            uStack_120 = 0x50;
          }
          uVar5 = 0x66;
          goto LAB_00104419;
        }
        Am_Input_Char::Am_Input_Char(&local_48,"9",true);
        bVar1 = Am_Input_Char::operator==(&c,local_48);
        if (!bVar1) {
          Am_Input_Char::Am_Input_Char(&local_4c,"a",true);
          bVar1 = Am_Input_Char::operator==(&c,local_4c);
          if (bVar1) {
            if (change_setting_proc(Am_Object)::modea == 0) {
              pAVar15 = (Am_Style *)&Am_Yellow;
            }
            else {
              pAVar15 = (Am_Style *)&Am_White;
            }
            change_setting_proc(Am_Object)::modea = change_setting_proc(Am_Object)::modea ^ 1;
            pAVar10 = Am_Style::operator_cast_to_Am_Wrapper_(pAVar15);
            Am_Object::Set(0xa330,(Am_Wrapper *)0x6a,(ulong)pAVar10);
            goto LAB_0010437e;
          }
          Am_Input_Char::Am_Input_Char(&local_50,"b",true);
          bVar1 = Am_Input_Char::operator==(&c,local_50);
          if (bVar1) {
            if (change_setting_proc(Am_Object)::modeb == '\x01') {
              change_setting_proc(Am_Object)::modeb = '\0';
LAB_001041c4:
              Am_Object::Destroy();
              goto LAB_0010437e;
            }
            change_setting_proc(Am_Object)::modeb = '\x01';
            Am_Object::Create((char *)&in_obj);
            pAVar11 = (Am_Object *)Am_Object::Set((ushort)&in_obj,100,0x177);
            Am_Object::operator=(&second,pAVar11);
            Am_Object::~Am_Object(&in_obj);
            Am_Object::Get_Object((ushort)&in_obj,0x10a2f8);
            pAVar9 = (Am_Value *)Am_Object::Get((ushort)&in_obj,0x86);
            iVar6 = Am_Value::operator_cast_to_int(pAVar9);
            Am_Object::~Am_Object(&in_obj);
            poVar13 = std::operator<<((ostream *)&std::cout,"Depth of r1 = ");
            poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar6);
            poVar13 = std::operator<<(poVar13," [-1]");
            std::endl<char,std::char_traits<char>>(poVar13);
            Am_Object::Am_Object(&local_b8,&second);
            Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_b8,0),1);
            pAVar11 = &local_b8;
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_54,"c",true);
            bVar1 = Am_Input_Char::operator==(&c,local_54);
            if (bVar1) {
              if (change_setting_proc(Am_Object)::modec != '\x01') {
                puVar12 = &change_setting_proc(Am_Object)::modec;
                goto LAB_0010430f;
              }
              change_setting_proc(Am_Object)::modec = '\0';
              Am_Object::Am_Object(&local_c0,&window);
              Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_c0,0),1);
              pAVar11 = &local_c0;
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_58,"d",true);
              bVar1 = Am_Input_Char::operator==(&c,local_58);
              if (bVar1) {
                if (change_setting_proc(Am_Object)::moded == '\x01') {
                  change_setting_proc(Am_Object)::moded = '\0';
                  goto LAB_001041c4;
                }
                change_setting_proc(Am_Object)::moded = '\x01';
                Am_Object::Copy((char *)&in_obj);
                pAVar11 = (Am_Object *)Am_Object::Set((ushort)&in_obj,0x65,0x1c7);
                Am_Object::operator=(&third,pAVar11);
                Am_Object::~Am_Object(&in_obj);
                Am_Object::Am_Object(&local_c8,&third);
                Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_c8,0),1);
                pAVar11 = &local_c8;
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_5c,"e",true);
                bVar1 = Am_Input_Char::operator==(&c,local_5c);
                if (bVar1) {
                  if (change_setting_proc(Am_Object)::modee == '\x01') {
                    change_setting_proc(Am_Object)::modee = '\0';
                    Am_Object::Get_Object((ushort)&local_d0,0x10a338);
                    Am_To_Bottom((Am_Object_Data *)&local_d0);
                    pAVar11 = &local_d0;
                  }
                  else {
                    change_setting_proc(Am_Object)::modee = '\x01';
                    Am_Object::Get_Object((ushort)&local_d8,0x10a338);
                    Am_To_Top((Am_Object_Data *)&local_d8);
                    pAVar11 = &local_d8;
                  }
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_60,"f",true);
                  bVar1 = Am_Input_Char::operator==(&c,local_60);
                  if (!bVar1) {
                    Am_Input_Char::Am_Input_Char(&local_64,"g",true);
                    bVar1 = Am_Input_Char::operator==(&c,local_64);
                    if (bVar1) {
                      pcVar14 = "Hello World";
                      if (change_setting_proc::mode != false) {
                        pcVar14 = "Foo and Bar";
                      }
                      uVar4 = 0x6d;
                      change_setting_proc::mode = (bool)(change_setting_proc::mode ^ 1);
                      goto LAB_00104131;
                    }
                    Am_Input_Char::Am_Input_Char(&local_68,"h",true);
                    bVar1 = Am_Input_Char::operator==(&c,local_68);
                    if (bVar1) {
                      bVar16 = change_setting_proc(Am_Object)::mode ^ 1;
                      uVar2 = 0x79;
                      change_setting_proc(Am_Object)::mode = (bool)bVar16;
                    }
                    else {
                      Am_Input_Char::Am_Input_Char(&local_6c,"i",true);
                      bVar1 = Am_Input_Char::operator==(&c,local_6c);
                      if (!bVar1) {
                        Am_Input_Char::Am_Input_Char(&local_70,"j",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_70);
                        if (bVar1) {
                          if (change_setting_proc(Am_Object)::mode == false) {
                            pAVar15 = (Am_Style *)&Am_Blue;
                          }
                          else {
                            pAVar15 = (Am_Style *)&Am_Orange;
                          }
                          pAVar10 = Am_Style::operator_cast_to_Am_Wrapper_(pAVar15);
                          Am_Object::Set(0xa2e8,(Am_Wrapper *)0x6a,(ulong)pAVar10);
                          change_setting_proc(Am_Object)::mode =
                               (bool)(change_setting_proc(Am_Object)::mode ^ 1);
                          goto LAB_0010437e;
                        }
                        Am_Input_Char::Am_Input_Char(&local_74,"k",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_74);
                        if (bVar1) {
                          (*(code *)(&DAT_00107014 +
                                    *(int *)(&DAT_00107014 +
                                            (ulong)(uint)change_setting_proc(Am_Object)::mode * 4)))
                                    ();
                          return;
                        }
                        Am_Input_Char::Am_Input_Char(&local_78,"l",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_78);
                        if (bVar1) {
                          (*(code *)(&DAT_00107004 +
                                    *(int *)(&DAT_00107004 +
                                            (ulong)(uint)change_setting_proc(Am_Object)::mode * 4)))
                                    ();
                          return;
                        }
                        Am_Input_Char::Am_Input_Char(&local_7c,"X",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_7c);
                        if (bVar1) {
                          pAVar9 = (Am_Value *)Am_Object::Get(0xa320,0x8b);
                          iVar6 = Am_Value::operator_cast_to_int(pAVar9);
                          Am_Object::Set(0xa320,0x8b,(ulong)(iVar6 + 5));
                          goto LAB_0010437e;
                        }
                        Am_Input_Char::Am_Input_Char(&local_80,"p",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_80);
                        if (bVar1) {
                          pAVar9 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11f);
                          iVar6 = Am_Value::operator_cast_to_int(pAVar9);
                          pAVar9 = (Am_Value *)Am_Object::Get((ushort)&inter,0x120);
                          uVar7 = Am_Value::operator_cast_to_int(pAVar9);
                          poVar13 = std::operator<<((ostream *)&std::cout,"Checking point (");
                          poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar6);
                          poVar13 = std::operator<<(poVar13,",");
                          poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,uVar7);
                          std::operator<<(poVar13,")\n");
                          std::ostream::flush();
                          Am_Point_In_Leaf(&in_obj,0x10a2e8,iVar6,(Am_Object *)(ulong)uVar7,true,
                                           true);
                          pAVar10 = Am_Object::operator_cast_to_Am_Wrapper_(&in_obj);
                          if (pAVar10 == (Am_Wrapper *)0x0) {
                            std::operator<<((ostream *)&std::cout," NOT in an object\n");
                          }
                          else {
                            poVar13 = std::operator<<((ostream *)&std::cout,"   in object ");
                            poVar13 = (ostream *)operator<<(poVar13,&in_obj);
                            std::endl<char,std::char_traits<char>>(poVar13);
                          }
                          std::ostream::flush();
                          goto LAB_00104115;
                        }
                        Am_Input_Char::Am_Input_Char(&local_84,"Y",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_84);
                        if (bVar1) {
                          pAVar9 = (Am_Value *)Am_Object::Get(0xa320,0x8b);
                          iVar6 = Am_Value::operator_cast_to_int(pAVar9);
                          pAVar9 = (Am_Value *)Am_Object::Get(0xa320,0x8c);
                          iVar8 = Am_Value::operator_cast_to_int(pAVar9);
                          Am_Object::Set(0xa320,0x8b,(ulong)(iVar6 + 5));
                          Am_Object::Set(0xa320,0x8c,(ulong)(iVar8 + 5));
                          goto LAB_0010437e;
                        }
                        Am_Input_Char::Am_Input_Char(&local_88,"M",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_88);
                        if (bVar1) {
                          pAVar9 = (Am_Value *)Am_Object::Get(0xa320,100);
                          iVar6 = Am_Value::operator_cast_to_int(pAVar9);
                          Am_Object::Set(0xa320,100,(ulong)(iVar6 + 5));
                          goto LAB_0010437e;
                        }
                        Am_Input_Char::Am_Input_Char(&local_8c,"W",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_8c);
                        if (bVar1) {
                          pAVar9 = (Am_Value *)Am_Object::Get(0xa320,0x66);
                          iVar6 = Am_Value::operator_cast_to_int(pAVar9);
                          Am_Object::Set(0xa320,0x66,(ulong)(iVar6 + 5));
                          goto LAB_0010437e;
                        }
                        Am_Input_Char::Am_Input_Char(&local_90,"R",true);
                        bVar1 = Am_Input_Char::operator==(&c,local_90);
                        if (!bVar1) {
                          Am_Input_Char::Am_Input_Char(&local_94,"C",true);
                          bVar1 = Am_Input_Char::operator==(&c,local_94);
                          if (!bVar1) goto LAB_00103ea5;
                          std::operator<<((ostream *)&std::cout,
                                          "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n"
                                         );
                          Am_Object::Create((char *)&in_obj);
                          Am_Object::Am_Object(&local_f8,&in_obj);
                          Am_Object::Add_Part((Am_Object)0x10a320,SUB81(&local_f8,0),1);
                          pAVar11 = &local_f8;
                          goto LAB_00104110;
                        }
                        uVar4 = Am_Object::Set(0xa320,0x8b,0x46);
                        uVar4 = Am_Object::Set(uVar4,0x8c,0xf);
                        uStack_120 = 0x91;
                        uVar4 = Am_Object::Set(uVar4,0x8d,0x91);
                        uVar5 = 0x8e;
                        goto LAB_0010400e;
                      }
                      bVar16 = change_setting_proc(Am_Object)::mode ^ 1;
                      uVar2 = 0x76;
                      change_setting_proc(Am_Object)::mode = (bool)bVar16;
                    }
                    uVar5 = 0xa2e8;
                    goto LAB_0010427c;
                  }
                  if (change_setting_proc(Am_Object)::modef == '\x01') {
                    change_setting_proc(Am_Object)::modef = '\0';
                    Am_Object::Am_Object(&local_e0,&r1);
                    Am_To_Bottom((Am_Object_Data *)&local_e0);
                    pAVar11 = &local_e0;
                  }
                  else {
                    change_setting_proc(Am_Object)::modef = '\x01';
                    Am_Object::Am_Object(&local_e8,&r1);
                    Am_Object::Am_Object(&local_f0,&r2);
                    Am_Move_Object((Am_Object_Data *)&local_e8,(Am_Object_Data *)&local_f0,true);
                    Am_Object::~Am_Object(&local_f0);
                    pAVar11 = &local_e8;
                  }
                }
              }
            }
          }
          goto LAB_0010423e;
        }
        change_setting_proc(Am_Object)::mode9 = change_setting_proc(Am_Object)::mode9 != '\x01';
        if ((bool)change_setting_proc(Am_Object)::mode9) {
          uStack_120 = 0xfa;
        }
        else {
          uStack_120 = 200;
        }
        uVar5 = 0x66;
        uVar4 = 0xa2e8;
      }
    }
LAB_0010400e:
    Am_Object::Set(uVar4,(uint)uVar5,uStack_120);
  }
LAB_0010437e:
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    if (screen2)
      screen2.Destroy();
    Am_Exit_Main_Event_Loop();
  } else if (c == "?") {
    print_help();
  } else if (c == "0") {
    static bool mode0 = false;
    if (mode0) {
      mode0 = false;
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
      window.Add_Part(g1);
      g1.Set(Am_LEFT, 140).Set(Am_TOP, 150);
    } else {
      mode0 = true;
      g1.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      g1.Remove_From_Owner();
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
    }
  } else if (c == "1") {
    static bool mode1 = false;
    if (mode1) {
      mode1 = false;
      window.Set(Am_TITLE, "Test Opal");
    } else {
      mode1 = true;
      window.Set(Am_TITLE, "Hello World!");
    }
  } else if (c == "2") {
    static bool mode2 = false;
    if (mode2) {
      mode2 = false;
      g1.Add_Part(eek = Am_Rectangle.Create("eek")
                            .Set(Am_FILL_STYLE, Am_Blue)
                            .Set(Am_LEFT, 5)
                            .Set(Am_TOP, 5)
                            .Set(Am_WIDTH, 50)
                            .Set(Am_HEIGHT, 30));
    } else {
      mode2 = true;
      eek.Destroy();
    }
  } else if (c == "3") {
    static bool mode3 = false;
    if (mode3) {
      mode3 = false;
      r2.Set(Am_VISIBLE, true);
      r2.Set(Am_LEFT, 20).Set(Am_TOP, 20);
    } else {
      mode3 = true;
      r2.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      r2.Set(Am_VISIBLE, false);
    }
  } else if (c == "4") {
    static bool mode4 = false;
    if (mode4) {
      mode4 = false;
      window.Add_Part(g1);
    } else {
      mode4 = true;
      g1.Remove_From_Owner();
    }
  } else if (c == "5") {
    if (!eek.Valid()) {
      cout << "** Can't do test 5 now because rectangle is gone; "
              "Use 2 to bring it back\n"
           << flush;
    } else {
      static bool mode5 = false;
      if (mode5) {
        mode5 = false;
        eek.Set(Am_LEFT, 5).Set(Am_TOP, 5);
      } else {
        mode5 = true;
        eek.Set(Am_LEFT, 10).Set(Am_TOP, 10);
      }
    }
  } else if (c == "6") {
    static bool mode6 = false;
    if (mode6) {
      mode6 = false;
      sw.Set(Am_TOP, 150);
    } else {
      mode6 = true;
      sw.Set(Am_TOP, 130);
    }
  } else if (c == "7") {
    static bool mode7 = false;
    if (mode7) {
      mode7 = false;
      sw.Set(Am_VISIBLE, true);
    } else {
      mode7 = true;
      sw.Set(Am_VISIBLE, false);
    }
  } else if (c == "8") {
    static bool mode8 = false;
    if (mode8) {
      mode8 = false;
      sw.Set(Am_WIDTH, 80);
    } else {
      mode8 = true;
      sw.Set(Am_WIDTH, 100);
    }
  } else if (c == "9") {
    static bool mode9 = false;
    if (mode9) {
      mode9 = false;
      window.Set(Am_WIDTH, 200);
    } else {
      mode9 = true;
      window.Set(Am_WIDTH, 250);
    }
  } else if (c == "a") {
    static bool modea = false;
    if (modea) {
      modea = false;
      r4.Set(Am_FILL_STYLE, Am_White);
    } else {
      modea = true;
      r4.Set(Am_FILL_STYLE, Am_Yellow);
    }
  } else if (c == "b") {
    static bool modeb = false;
    if (modeb) {
      modeb = false;
      second.Destroy();
    } else {
      modeb = true;
      second = window.Create("new window").Set(Am_LEFT, 375);
      int depth = second.Get_Object(PART1).Get(Am_OWNER_DEPTH);
      cout << "Depth of r1 = " << depth << " [-1]" << endl;
      Am_Screen.Add_Part(second);
    }
  } else if (c == "c") {
    static bool modec = false;
    if (modec) {
      modec = false;
      Am_Screen.Add_Part(window);
    } else {
      modec = true;
      window.Remove_From_Owner();
    }
  } else if (c == "d") {
    static bool moded = false;
    if (moded) {
      moded = false;
      third.Destroy();
    } else {
      moded = true;
      third = window.Copy().Set(Am_TOP, 455);
      Am_Screen.Add_Part(third);
    }
  } else if (c == "e") {
    static bool modee = false;
    if (modee) {
      modee = false;
      Am_To_Bottom(g1.Get_Object(OOK));
    } else {
      modee = true;
      Am_To_Top(g1.Get_Object(OOK));
    }
  } else if (c == "f") {
    static bool modef = false;
    if (modef) {
      modef = false;
      Am_To_Bottom(r1);
    } else {
      modef = true;
      Am_Move_Object(r1, r2, true);
    }
  } else if (c == "g") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICON_TITLE, mode ? "Hello World" : "Foo and Bar");
  } else if (c == "h") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_OMIT_TITLE_BAR, mode);
  } else if (c == "i") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICONIFIED, mode);
  } else if (c == "j") {
    static bool mode = false;
    window.Set(Am_FILL_STYLE, mode ? Am_Orange : Am_Blue);
    mode = !mode;
  } else if (c == "k") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "use min = false" << endl;
      window.Set(Am_MIN_WIDTH, 50);
      break;
    case 1:
      cout << "min width = 50" << endl;
      window.Set(Am_USE_MIN_WIDTH, true);
      break;
    case 2:
      cout << "min width = 70" << endl;
      window.Set(Am_MIN_WIDTH, 70);
      break;
    case 3:
      cout << "min width = false" << endl;
      window.Set(Am_USE_MIN_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "l") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "max width = false max height = 250" << endl;
      window.Set(Am_MAX_WIDTH, 200);
      window.Set(Am_MAX_HEIGHT, 250);
      window.Set(Am_USE_MAX_HEIGHT, true);
      break;
    case 1:
      cout << "max width = 200 max height = 250" << endl;
      window.Set(Am_USE_MAX_WIDTH, true);
      break;
    case 2:
      cout << "max width = 150 max height = false" << endl;
      window.Set(Am_MAX_WIDTH, 150);
      window.Set(Am_USE_MAX_HEIGHT, false);
      break;
    case 3:
      cout << "max width = false max height = false" << endl;
      window.Set(Am_USE_MAX_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "X") {
    int x1 = l1.Get(Am_X1);
    l1.Set(Am_X1, x1 + 5);
  } else if (c == "p") {
    int x = inter.Get(Am_FIRST_X);
    int y = inter.Get(Am_FIRST_Y);
    cout << "Checking point (" << x << "," << y << ")\n" << flush;
    Am_Object in_obj = Am_Point_In_Leaf(window, x, y, window);
    if (in_obj)
      cout << "   in object " << in_obj << endl << flush;
    else
      cout << " NOT in an object\n" << flush;
  } else if (c == "Y") {
    int x1 = l1.Get(Am_X1);
    int y1 = l1.Get(Am_Y1);
    l1.Set(Am_X1, x1 + 5);
    l1.Set(Am_Y1, y1 + 5);
  } else if (c == "M") {
    int left = l1.Get(Am_LEFT);
    // int top = l1.Get(Am_TOP);
    l1.Set(Am_LEFT, left + 5);
    // l1.Set(Am_TOP, top+5);
  } else if (c == "W") {
    int width = l1.Get(Am_WIDTH);
    //int height = l1.Get(Am_HEIGHT);
    l1.Set(Am_WIDTH, width + 5);
    //l1.Set(Am_HEIGHT, height+5);
  } else if (c == "R") {
    l1.Set(Am_X1, 70).Set(Am_Y1, 15).Set(Am_X2, 145).Set(Am_Y2, 145);
  } else if (c == "C") {
    cout << "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n";
    Am_Object o2 = Am_Rectangle.Create();
    l1.Add_Part(o2);
  } else
    print_help();
}